

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::computePixelScaleBias(ConstPixelBufferAccess *access,Vec4 *scale,Vec4 *bias)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  float local_58;
  float local_50;
  int local_48;
  int c;
  float eps;
  Vec4 maxVal;
  Vec4 minVal;
  Vec4 *bias_local;
  Vec4 *scale_local;
  ConstPixelBufferAccess *access_local;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)(maxVal.m_data + 2));
  Vector<float,_4>::Vector((Vector<float,_4> *)&c);
  estimatePixelValueRange(access,(Vec4 *)(maxVal.m_data + 2),(Vec4 *)&c);
  for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
    pfVar3 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c,local_48);
    fVar1 = *pfVar3;
    pfVar3 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),local_48);
    if (0.0001 <= fVar1 - *pfVar3) {
      pfVar3 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c,local_48);
      fVar1 = *pfVar3;
      pfVar3 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),local_48);
      fVar2 = *pfVar3;
      pfVar3 = Vector<float,_4>::operator[](scale,local_48);
      *pfVar3 = 1.0 / (fVar1 - fVar2);
      pfVar3 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),local_48);
      fVar1 = *pfVar3;
      pfVar3 = Vector<float,_4>::operator[](scale,local_48);
      fVar2 = *pfVar3;
      pfVar3 = Vector<float,_4>::operator[](bias,local_48);
      *pfVar3 = -fVar1 * fVar2 + 0.0;
    }
    else {
      pfVar3 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c,local_48);
      if (0.0001 < *pfVar3 || *pfVar3 == 0.0001) {
        pfVar3 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c,local_48);
        local_50 = 1.0 / *pfVar3;
      }
      else {
        local_50 = 1.0;
      }
      pfVar3 = Vector<float,_4>::operator[](scale,local_48);
      *pfVar3 = local_50;
      if (local_48 == 3) {
        pfVar3 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c,3);
        fVar1 = *pfVar3;
        pfVar3 = Vector<float,_4>::operator[](scale,3);
        local_58 = -fVar1 * *pfVar3 + 1.0;
      }
      else {
        pfVar3 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),local_48);
        fVar1 = *pfVar3;
        pfVar3 = Vector<float,_4>::operator[](scale,local_48);
        local_58 = -fVar1 * *pfVar3 + 0.0;
      }
      pfVar3 = Vector<float,_4>::operator[](bias,local_48);
      *pfVar3 = local_58;
    }
  }
  return;
}

Assistant:

void computePixelScaleBias (const ConstPixelBufferAccess& access, Vec4& scale, Vec4& bias)
{
	Vec4 minVal, maxVal;
	estimatePixelValueRange(access, minVal, maxVal);

	const float eps = 0.0001f;

	for (int c = 0; c < 4; c++)
	{
		if (maxVal[c] - minVal[c] < eps)
		{
			scale[c]	= (maxVal[c] < eps) ? 1.0f : (1.0f / maxVal[c]);
			bias[c]		= (c == 3) ? (1.0f - maxVal[c]*scale[c]) : (0.0f - minVal[c]*scale[c]);
		}
		else
		{
			scale[c]	= 1.0f / (maxVal[c] - minVal[c]);
			bias[c]		= 0.0f - minVal[c]*scale[c];
		}
	}
}